

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O0

matrix4 * matrix4_make_transformation_rotationv3_EXP(matrix4 *self,vector3 *vR)

{
  matrix4 *pmVar1;
  undefined1 local_98 [8];
  matrix4 scratchMatrix;
  vector3 *vR_local;
  matrix4 *self_local;
  
  scratchMatrix.field_0.m[0xf] = (double)vR;
  matrix4_identity(self);
  pmVar1 = matrix4_set_from_euler_anglesf3_EXP
                     ((matrix4 *)local_98,*(double *)scratchMatrix.field_0.m[0xf],
                      *(double *)((long)scratchMatrix.field_0.m[0xf] + 8),
                      *(double *)((long)scratchMatrix.field_0.m[0xf] + 0x10));
  pmVar1 = matrix4_multiply(self,pmVar1);
  return pmVar1;
}

Assistant:

HYPAPI struct matrix4 *matrix4_make_transformation_rotationv3_EXP(struct matrix4 *self, const struct vector3 *vR)
{
	struct matrix4 scratchMatrix;

	matrix4_identity(self);

	return matrix4_multiply(self,
		matrix4_set_from_euler_anglesf3_EXP(&scratchMatrix, vR->x, vR->y, vR->z));
}